

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  setDocumentLocatorSAXFunc p_Var2;
  startDocumentSAXFunc p_Var3;
  xmlParserInputPtr pxVar4;
  __int32_t *p_Var5;
  endDocumentSAXFunc p_Var6;
  int iVar7;
  __int32_t **pp_Var8;
  xmlDtdPtr pxVar9;
  int iVar10;
  xmlChar *pxVar11;
  
  iVar7 = -1;
  if ((ctxt != (htmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var2 = ctxt->sax->setDocumentLocator, p_Var2 != (setDocumentLocatorSAXFunc)0x0)) {
      (*p_Var2)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    if (((ctxt->input->flags & 1) == 0) &&
       (iVar7 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar7 == 0)) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
    }
    htmlSkipBlankChars(ctxt);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var3 = ctxt->sax->startDocument, p_Var3 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var3)(ctxt->userData);
    }
    pxVar4 = ctxt->input;
    pxVar11 = pxVar4->cur;
    xVar1 = *pxVar11;
    while (xVar1 == '<') {
      if (pxVar11[1] == '?') {
        pxVar11 = pxVar11 + 1;
        iVar7 = 1;
        iVar10 = 1;
      }
      else {
        if (pxVar11[1] != '!') break;
        if ((pxVar11[2] != '-') || (pxVar11[3] != '-')) {
          pp_Var8 = __ctype_toupper_loc();
          p_Var5 = *pp_Var8;
          if ((((p_Var5[pxVar11[2]] == 0x44) &&
               ((p_Var5[pxVar11[3]] == 0x4f && (p_Var5[pxVar11[4]] == 0x43)))) &&
              (p_Var5[pxVar11[5]] == 0x54)) &&
             (((p_Var5[pxVar11[6]] == 0x59 && (p_Var5[pxVar11[7]] == 0x50)) &&
              (p_Var5[pxVar11[8]] == 0x45)))) {
            ctxt->instate = XML_PARSER_MISC;
            htmlParseDocTypeDecl(ctxt);
          }
          break;
        }
        pxVar11 = pxVar11 + 4;
        iVar10 = 0;
        iVar7 = 4;
      }
      pxVar4->cur = pxVar11;
      pxVar4->col = pxVar4->col + iVar7;
      htmlParseComment(ctxt,iVar10);
      htmlSkipBlankChars(ctxt);
      pxVar4 = ctxt->input;
      pxVar11 = pxVar4->cur;
      xVar1 = *pxVar11;
    }
    htmlSkipBlankChars(ctxt);
    ctxt->instate = XML_PARSER_PROLOG;
    pxVar4 = ctxt->input;
    pxVar11 = pxVar4->cur;
    xVar1 = *pxVar11;
    while (xVar1 == '<') {
      if (pxVar11[1] == '?') {
        pxVar11 = pxVar11 + 1;
        iVar10 = 1;
        iVar7 = 1;
      }
      else {
        if (((pxVar11[1] != '!') || (pxVar11[2] != '-')) || (pxVar11[3] != '-')) break;
        pxVar11 = pxVar11 + 4;
        iVar7 = 0;
        iVar10 = 4;
      }
      pxVar4->cur = pxVar11;
      pxVar4->col = pxVar4->col + iVar10;
      htmlParseComment(ctxt,iVar7);
      htmlSkipBlankChars(ctxt);
      pxVar4 = ctxt->input;
      pxVar11 = pxVar4->cur;
      xVar1 = *pxVar11;
    }
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);
    if (*ctxt->input->cur == '\0') {
      htmlAutoCloseOnEnd(ctxt);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var6 = ctxt->sax->endDocument, p_Var6 != (endDocumentSAXFunc)0x0)) {
      (*p_Var6)(ctxt->userData);
    }
    if ((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
       (pxVar9 = xmlGetIntSubset(ctxt->myDoc), pxVar9 == (xmlDtdPtr)0x0)) {
      pxVar9 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                  (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                  (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      ctxt->myDoc->intSubset = pxVar9;
      if (pxVar9 == (xmlDtdPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
      }
    }
    iVar7 = -(uint)(ctxt->wellFormed == 0);
  }
  return iVar7;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlDtdPtr dtd;

    if ((ctxt == NULL) || (ctxt->input == NULL))
	return(-1);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    /*
     * TODO: Implement HTML5 prescan algorithm
     */

    /*
     * This is wrong but matches long-standing behavior. In most
     * cases, a document starting with an XML declaration will
     * specify UTF-8. The HTML5 prescan algorithm handles
     * XML declarations in a better way.
     */
    if (((ctxt->input->flags & XML_INPUT_HAS_ENCODING) == 0) &&
        (xmlStrncmp(ctxt->input->cur, BAD_CAST "<?xm", 4) == 0))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_UTF8);

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);

    /*
     * Parse possible comments and PIs before any content
     */
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
        ctxt->instate = XML_PARSER_MISC;
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    ctxt->instate = XML_PARSER_PROLOG;
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL) {
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
            if (ctxt->myDoc->intSubset == NULL)
                htmlErrMemory(ctxt);
        }
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}